

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_discovery_send(int sock)

{
  int iVar1;
  ssize_t sVar2;
  socklen_t local_cc;
  sockaddr *psStack_c8;
  socklen_t saddrlen;
  sockaddr *saddr;
  sockaddr_in6 addr6;
  sockaddr_in addr;
  sockaddr_storage addr_storage;
  int sock_local;
  
  psStack_c8 = (sockaddr *)addr.sin_zero;
  local_cc = 0x80;
  iVar1 = getsockname(sock,psStack_c8,&local_cc);
  if (iVar1 == 0) {
    if (*(short *)psStack_c8 == 10) {
      memset((void *)((long)&saddr + 4),0,0x1c);
      saddr._4_2_ = 10;
      addr6.sin6_family._0_1_ = 0xff;
      addr6.sin6_family._1_1_ = 2;
      addr6.sin6_addr.__in6_u.__u6_addr8[7] = 0xfb;
      saddr._6_2_ = htons(0x14e9);
      psStack_c8 = (sockaddr *)((long)&saddr + 4);
      local_cc = 0x1c;
    }
    else {
      memset((void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0,0x10);
      addr6.sin6_addr.__in6_u.__u6_addr16[6] = 2;
      addr6.sin6_scope_id = htonl(0xe00000fb);
      addr6.sin6_addr.__in6_u.__u6_addr16[7] = htons(0x14e9);
      psStack_c8 = (sockaddr *)((long)&addr6.sin6_addr.__in6_u + 0xc);
      local_cc = 0x10;
    }
    sVar2 = sendto(sock,"",0x2e,0,psStack_c8,local_cc);
    if (sVar2 < 0) {
      addr_storage.__ss_align._4_4_ = -1;
    }
    else {
      addr_storage.__ss_align._4_4_ = 0;
    }
  }
  else {
    addr_storage.__ss_align._4_4_ = -1;
  }
  return addr_storage.__ss_align._4_4_;
}

Assistant:

int
mdns_discovery_send(int sock) {
	struct sockaddr_storage addr_storage;
	struct sockaddr_in addr;
	struct sockaddr_in6 addr6;
	struct sockaddr* saddr = (struct sockaddr*)&addr_storage;
	socklen_t saddrlen = sizeof(struct sockaddr_storage);
	if (getsockname(sock, saddr, &saddrlen))
		return -1;
	if (saddr->sa_family == AF_INET6) {
		memset(&addr6, 0, sizeof(struct sockaddr_in6));
		addr6.sin6_family = AF_INET6;
#ifdef __APPLE__
		addr6.sin6_len = sizeof(struct sockaddr_in6);
#endif
		addr6.sin6_addr.s6_addr[0] = 0xFF;
		addr6.sin6_addr.s6_addr[1] = 0x02;
		addr6.sin6_addr.s6_addr[15] = 0xFB;
		addr6.sin6_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr6;
		saddrlen = sizeof(struct sockaddr_in6);
	}
	else {
		memset(&addr, 0, sizeof(struct sockaddr_in));
		addr.sin_family = AF_INET;
#ifdef __APPLE__
		addr.sin_len = sizeof(struct sockaddr_in);
#endif
		addr.sin_addr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
		addr.sin_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr;
		saddrlen = sizeof(struct sockaddr_in);
	}

	if (sendto(sock, mdns_services_query, sizeof(mdns_services_query), 0,
	           saddr, saddrlen) < 0)
		return -1;
	return 0;
}